

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int nn_req_crecv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  nn_req *local_30;
  nn_req *req;
  nn_msg *msg_local;
  nn_sockbase *self_local;
  
  local_30 = (nn_req *)self;
  if (self == (nn_sockbase *)0x0) {
    local_30 = (nn_req *)0x0;
  }
  iVar1 = nn_req_inprogress(local_30);
  if (iVar1 == 0) {
    self_local._4_4_ = -0x9523dfe;
  }
  else if (local_30->state == 8) {
    nn_msg_mv(msg,&(local_30->task).reply);
    nn_msg_init(&(local_30->task).reply,0);
    nn_fsm_action(&local_30->fsm,5);
    self_local._4_4_ = 0;
  }
  else {
    self_local._4_4_ = -0xb;
  }
  return self_local._4_4_;
}

Assistant:

int nn_req_crecv (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  No request was sent. Waiting for a reply doesn't make sense. */
    if (nn_slow (!nn_req_inprogress (req)))
        return -EFSM;

    /*  If reply was not yet recieved, wait further. */
    if (nn_slow (req->state != NN_REQ_STATE_DONE))
        return -EAGAIN;

    /*  If the reply was already received, just pass it to the caller. */
    nn_msg_mv (msg, &req->task.reply);
    nn_msg_init (&req->task.reply, 0);

    /*  Notify the state machine. */
    nn_fsm_action (&req->fsm, NN_REQ_ACTION_RECEIVED);

    return 0;
}